

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O2

void embree::avx::SphereMiIntersectorK<4,_8,_true>::intersect
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *sphere)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  Geometry *pGVar5;
  __int_type_conflict _Var6;
  uint uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  RayHitK<8> *pRVar10;
  Scene *pSVar12;
  long lVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  float fVar23;
  float fVar31;
  float fVar32;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar33;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar44 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  SphereIntersectorHitM<4> hit;
  HitK<8> h;
  undefined1 local_320 [16];
  Primitive *local_308;
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  Scene *local_2a8;
  undefined1 *local_2a0;
  void *local_298;
  RTCRayQueryContext *local_290;
  RayHitK<8> *local_288;
  undefined1 (*local_280) [32];
  undefined4 local_278;
  undefined1 local_270 [16];
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [16];
  undefined1 local_230 [16];
  undefined1 local_220 [16];
  undefined1 local_210 [16];
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [16];
  undefined1 local_190 [16];
  undefined1 local_180 [32];
  undefined4 local_160;
  undefined4 uStack_15c;
  undefined4 uStack_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  uint local_e0;
  uint uStack_dc;
  uint uStack_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar11;
  undefined1 auVar43 [64];
  undefined1 auVar45 [64];
  undefined1 auVar48 [64];
  
  pSVar12 = context->scene;
  pGVar5 = (pSVar12->geometries).items[sphere->sharedGeomID].ptr;
  lVar13 = *(long *)&pGVar5->field_0x58;
  _Var6 = pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar24 = *(undefined1 (*) [16])(lVar13 + (sphere->primIDs).field_0.i[0] * _Var6);
  auVar19 = *(undefined1 (*) [16])(lVar13 + (sphere->primIDs).field_0.i[1] * _Var6);
  auVar27 = *(undefined1 (*) [16])(lVar13 + (sphere->primIDs).field_0.i[2] * _Var6);
  auVar47 = *(undefined1 (*) [16])(lVar13 + (sphere->primIDs).field_0.i[3] * _Var6);
  auVar34 = vunpcklps_avx(auVar24,auVar27);
  auVar24 = vunpckhps_avx(auVar24,auVar27);
  auVar27 = vunpcklps_avx(auVar19,auVar47);
  auVar19 = vunpckhps_avx(auVar19,auVar47);
  auVar47 = vunpcklps_avx(auVar34,auVar27);
  auVar27 = vunpckhps_avx(auVar34,auVar27);
  auVar17 = vunpcklps_avx(auVar24,auVar19);
  auVar36 = vunpckhps_avx(auVar24,auVar19);
  auVar24 = vpshufd_avx(ZEXT116(sphere->numPrimitives),0);
  auVar19 = vpcmpgtd_avx(auVar24,_DAT_01f4ad30);
  local_190 = vpshufd_avx(ZEXT416(sphere->sharedGeomID),0);
  uVar9 = *(undefined4 *)(ray + k * 4);
  auVar41._4_4_ = uVar9;
  auVar41._0_4_ = uVar9;
  auVar41._8_4_ = uVar9;
  auVar41._12_4_ = uVar9;
  auVar47 = vsubps_avx(auVar47,auVar41);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar34._4_4_ = uVar9;
  auVar34._0_4_ = uVar9;
  auVar34._8_4_ = uVar9;
  auVar34._12_4_ = uVar9;
  auVar34 = vsubps_avx(auVar27,auVar34);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar24._4_4_ = uVar9;
  auVar24._0_4_ = uVar9;
  auVar24._8_4_ = uVar9;
  auVar24._12_4_ = uVar9;
  auVar17 = vsubps_avx(auVar17,auVar24);
  fVar1 = *(float *)(ray + k * 4 + 0x80);
  auVar53 = ZEXT1664(CONCAT412(fVar1,CONCAT48(fVar1,CONCAT44(fVar1,fVar1))));
  fVar2 = *(float *)(ray + k * 4 + 0xa0);
  auVar54 = ZEXT1664(CONCAT412(fVar2,CONCAT48(fVar2,CONCAT44(fVar2,fVar2))));
  fVar3 = *(float *)(ray + k * 4 + 0xc0);
  auVar55 = ZEXT1664(CONCAT412(fVar3,CONCAT48(fVar3,CONCAT44(fVar3,fVar3))));
  auVar24 = ZEXT416((uint)(fVar1 * fVar1 + fVar2 * fVar2 + fVar3 * fVar3));
  auVar27 = vshufps_avx(auVar24,auVar24,0);
  auVar24 = vrcpps_avx(auVar27);
  fVar23 = auVar24._0_4_;
  auVar25._0_4_ = fVar23 * auVar27._0_4_;
  fVar31 = auVar24._4_4_;
  auVar25._4_4_ = fVar31 * auVar27._4_4_;
  fVar32 = auVar24._8_4_;
  auVar25._8_4_ = fVar32 * auVar27._8_4_;
  fVar33 = auVar24._12_4_;
  auVar25._12_4_ = fVar33 * auVar27._12_4_;
  auVar27._8_4_ = 0x3f800000;
  auVar27._0_8_ = 0x3f8000003f800000;
  auVar27._12_4_ = 0x3f800000;
  auVar24 = vsubps_avx(auVar27,auVar25);
  fVar23 = fVar23 + fVar23 * auVar24._0_4_;
  fVar31 = fVar31 + fVar31 * auVar24._4_4_;
  fVar32 = fVar32 + fVar32 * auVar24._8_4_;
  fVar33 = fVar33 + fVar33 * auVar24._12_4_;
  auVar35._0_4_ = (fVar1 * auVar47._0_4_ + fVar2 * auVar34._0_4_ + fVar3 * auVar17._0_4_) * fVar23;
  auVar35._4_4_ = (fVar1 * auVar47._4_4_ + fVar2 * auVar34._4_4_ + fVar3 * auVar17._4_4_) * fVar31;
  auVar35._8_4_ = (fVar1 * auVar47._8_4_ + fVar2 * auVar34._8_4_ + fVar3 * auVar17._8_4_) * fVar32;
  auVar35._12_4_ =
       (fVar1 * auVar47._12_4_ + fVar2 * auVar34._12_4_ + fVar3 * auVar17._12_4_) * fVar33;
  auVar46._0_4_ = fVar1 * auVar35._0_4_;
  auVar46._4_4_ = fVar1 * auVar35._4_4_;
  auVar46._8_4_ = fVar1 * auVar35._8_4_;
  auVar46._12_4_ = fVar1 * auVar35._12_4_;
  auVar49._0_4_ = fVar2 * auVar35._0_4_;
  auVar49._4_4_ = fVar2 * auVar35._4_4_;
  auVar49._8_4_ = fVar2 * auVar35._8_4_;
  auVar49._12_4_ = fVar2 * auVar35._12_4_;
  auVar51._0_4_ = fVar3 * auVar35._0_4_;
  auVar51._4_4_ = fVar3 * auVar35._4_4_;
  auVar51._8_4_ = fVar3 * auVar35._8_4_;
  auVar51._12_4_ = fVar3 * auVar35._12_4_;
  auVar27 = vsubps_avx(auVar47,auVar46);
  auVar56 = ZEXT1664(auVar27);
  auVar47 = vsubps_avx(auVar34,auVar49);
  auVar50 = ZEXT1664(auVar47);
  auVar34 = vsubps_avx(auVar17,auVar51);
  auVar52 = ZEXT1664(auVar34);
  auVar39._0_4_ =
       auVar27._0_4_ * auVar27._0_4_ + auVar47._0_4_ * auVar47._0_4_ + auVar34._0_4_ * auVar34._0_4_
  ;
  auVar39._4_4_ =
       auVar27._4_4_ * auVar27._4_4_ + auVar47._4_4_ * auVar47._4_4_ + auVar34._4_4_ * auVar34._4_4_
  ;
  auVar39._8_4_ =
       auVar27._8_4_ * auVar27._8_4_ + auVar47._8_4_ * auVar47._8_4_ + auVar34._8_4_ * auVar34._8_4_
  ;
  auVar39._12_4_ =
       auVar27._12_4_ * auVar27._12_4_ +
       auVar47._12_4_ * auVar47._12_4_ + auVar34._12_4_ * auVar34._12_4_;
  auVar16._0_4_ = auVar36._0_4_ * auVar36._0_4_;
  auVar16._4_4_ = auVar36._4_4_ * auVar36._4_4_;
  auVar16._8_4_ = auVar36._8_4_ * auVar36._8_4_;
  auVar16._12_4_ = auVar36._12_4_ * auVar36._12_4_;
  auVar24 = vcmpps_avx(auVar39,auVar16,2);
  auVar17 = auVar19 & auVar24;
  if ((((auVar17 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar17 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar17 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar17[0xf] < '\0') {
    auVar24 = vandps_avx(auVar24,auVar19);
    auVar19 = vsubps_avx(auVar16,auVar39);
    auVar17._0_4_ = fVar23 * auVar19._0_4_;
    auVar17._4_4_ = fVar31 * auVar19._4_4_;
    auVar17._8_4_ = fVar32 * auVar19._8_4_;
    auVar17._12_4_ = fVar33 * auVar19._12_4_;
    auVar16 = vsqrtps_avx(auVar17);
    auVar57 = ZEXT1664(auVar16);
    auVar25 = vsubps_avx(auVar35,auVar16);
    auVar42._0_4_ = auVar16._0_4_ + auVar35._0_4_;
    auVar42._4_4_ = auVar16._4_4_ + auVar35._4_4_;
    auVar42._8_4_ = auVar16._8_4_ + auVar35._8_4_;
    auVar42._12_4_ = auVar16._12_4_ + auVar35._12_4_;
    auVar43 = ZEXT1664(auVar42);
    uVar9 = *(undefined4 *)(ray + k * 4 + 0x60);
    auVar36._4_4_ = uVar9;
    auVar36._0_4_ = uVar9;
    auVar36._8_4_ = uVar9;
    auVar36._12_4_ = uVar9;
    auVar19 = vcmpps_avx(auVar36,auVar25,2);
    uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar44._4_4_ = uVar9;
    auVar44._0_4_ = uVar9;
    auVar44._8_4_ = uVar9;
    auVar44._12_4_ = uVar9;
    auVar45 = ZEXT1664(auVar44);
    auVar17 = vcmpps_avx(auVar25,auVar44,2);
    local_270 = vandps_avx(auVar17,auVar19);
    auVar19 = vandps_avx(local_270,auVar24);
    auVar17 = vcmpps_avx(auVar36,auVar42,2);
    auVar36 = vcmpps_avx(auVar42,auVar44,2);
    auVar17 = vandps_avx(auVar17,auVar36);
    auVar24 = vandps_avx(auVar17,auVar24);
    auVar40 = ZEXT1664(auVar24);
    local_320 = vorps_avx(auVar19,auVar24);
    if ((((local_320 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (local_320 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (local_320 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        local_320[0xf] < '\0') {
      local_260 = vblendvps_avx(auVar42,auVar25,auVar19);
      auVar18._0_8_ = auVar16._0_8_ ^ 0x8000000080000000;
      auVar18._8_4_ = -auVar16._8_4_;
      auVar18._12_4_ = -auVar16._12_4_;
      auVar24 = vblendvps_avx(auVar16,auVar18,auVar19);
      fVar23 = auVar24._0_4_;
      auVar26._0_4_ = fVar1 * fVar23;
      fVar31 = auVar24._4_4_;
      auVar26._4_4_ = fVar1 * fVar31;
      fVar32 = auVar24._8_4_;
      auVar26._8_4_ = fVar1 * fVar32;
      fVar33 = auVar24._12_4_;
      auVar26._12_4_ = fVar1 * fVar33;
      auVar37._0_4_ = fVar2 * fVar23;
      auVar37._4_4_ = fVar2 * fVar31;
      auVar37._8_4_ = fVar2 * fVar32;
      auVar37._12_4_ = fVar2 * fVar33;
      auVar19._0_4_ = fVar3 * fVar23;
      auVar19._4_4_ = fVar3 * fVar31;
      auVar19._8_4_ = fVar3 * fVar32;
      auVar19._12_4_ = fVar3 * fVar33;
      local_250 = vsubps_avx(auVar26,auVar27);
      local_240 = vsubps_avx(auVar37,auVar47);
      local_230 = vsubps_avx(auVar19,auVar34);
      auVar47._8_4_ = 0x7f800000;
      auVar47._0_8_ = 0x7f8000007f800000;
      auVar47._12_4_ = 0x7f800000;
      auVar48 = ZEXT1664(auVar47);
      local_1a0 = local_260;
      auVar24 = vblendvps_avx(auVar47,local_260,local_320);
      auVar19 = vshufps_avx(auVar24,auVar24,0xb1);
      auVar19 = vminps_avx(auVar19,auVar24);
      auVar27 = vshufpd_avx(auVar19,auVar19,1);
      auVar19 = vminps_avx(auVar27,auVar19);
      auVar19 = vcmpps_avx(auVar24,auVar19,0);
      auVar27 = local_320 & auVar19;
      auVar24 = vpcmpeqd_avx(auVar24,auVar24);
      if ((((auVar27 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar27 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar27 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar27[0xf] < '\0'
         ) {
        auVar24 = auVar19;
      }
      auVar24 = vandps_avx(local_320,auVar24);
      uVar7 = vmovmskps_avx(auVar24);
      lVar13 = 0;
      if (uVar7 != 0) {
        for (; (uVar7 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
        }
      }
      uVar7 = 1 << ((byte)k & 0x1f);
      auVar58 = ZEXT864(0) << 0x20;
      do {
        auVar24 = auVar40._0_16_;
        auVar19 = auVar50._0_16_;
        auVar27 = auVar53._0_16_;
        local_280 = &local_180;
        local_2a0 = local_300;
        auVar30 = auVar52._0_32_;
        auVar17 = auVar56._0_16_;
        auVar34 = auVar55._0_16_;
        auVar47 = auVar54._0_16_;
        auVar36 = auVar57._0_16_;
        uVar4 = *(uint *)(local_190 + lVar13 * 4);
        pRVar10 = (RayHitK<8> *)(ulong)uVar4;
        pGVar5 = (pSVar12->geometries).items[(long)pRVar10].ptr;
        local_288 = ray;
        if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
          *(undefined4 *)(local_320 + lVar13 * 4) = 0;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            auVar45 = ZEXT464(*(uint *)(local_260 + lVar13 * 4));
            *(uint *)(ray + k * 4 + 0x100) = *(uint *)(local_260 + lVar13 * 4);
            *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_250 + lVar13 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_240 + lVar13 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_230 + lVar13 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1e0) = 0;
            *(undefined4 *)(ray + k * 4 + 0x200) = 0;
            *(uint *)(ray + k * 4 + 0x220) = (sphere->primIDs).field_0.i[lVar13];
            *(uint *)(ray + k * 4 + 0x240) = uVar4;
            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
            uVar9 = 0;
            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
LAB_00761c59:
            auVar16 = vshufps_avx(auVar45._0_16_,auVar45._0_16_,0);
            local_260 = auVar43._0_16_;
            auVar16 = vcmpps_avx(local_260,auVar16,2);
            auVar16 = vandps_avx(auVar16,local_270);
            auVar25 = auVar24 & auVar16;
            if ((((auVar25 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (auVar25 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar25 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar25[0xf]) {
              return;
            }
            local_320 = vandps_avx(auVar16,auVar24);
            fVar1 = auVar36._0_4_;
            auVar20._0_4_ = auVar27._0_4_ * fVar1;
            fVar2 = auVar36._4_4_;
            auVar20._4_4_ = auVar27._4_4_ * fVar2;
            fVar3 = auVar36._8_4_;
            auVar20._8_4_ = auVar27._8_4_ * fVar3;
            fVar23 = auVar36._12_4_;
            auVar20._12_4_ = auVar27._12_4_ * fVar23;
            auVar28._0_4_ = auVar47._0_4_ * fVar1;
            auVar28._4_4_ = auVar47._4_4_ * fVar2;
            auVar28._8_4_ = auVar47._8_4_ * fVar3;
            auVar28._12_4_ = auVar47._12_4_ * fVar23;
            auVar38._0_4_ = auVar34._0_4_ * fVar1;
            auVar38._4_4_ = auVar34._4_4_ * fVar2;
            auVar38._8_4_ = auVar34._8_4_ * fVar3;
            auVar38._12_4_ = auVar34._12_4_ * fVar23;
            local_250 = vsubps_avx(auVar20,auVar17);
            local_240 = vsubps_avx(auVar28,auVar19);
            local_230 = vsubps_avx(auVar38,auVar30._0_16_);
            pSVar12 = context->scene;
            auVar24 = vblendvps_avx(auVar48._0_16_,local_260,local_320);
            auVar19 = vshufps_avx(auVar24,auVar24,0xb1);
            auVar19 = vminps_avx(auVar19,auVar24);
            auVar27 = vshufpd_avx(auVar19,auVar19,1);
            auVar19 = vminps_avx(auVar27,auVar19);
            auVar19 = vcmpps_avx(auVar24,auVar19,0);
            auVar27 = local_320 & auVar19;
            auVar24 = local_320;
            if ((((auVar27 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar27 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar27 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar27[0xf] < '\0') {
              auVar24 = vandps_avx(auVar19,local_320);
            }
            uVar8 = vmovmskps_avx(auVar24);
            lVar13 = 0;
            if (CONCAT44(uVar9,uVar8) != 0) {
              for (; (CONCAT44(uVar9,uVar8) >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
              }
            }
            auVar30 = vcmpps_avx(auVar30,auVar30,0xf);
            auVar50 = ZEXT3264(auVar30);
            auVar52 = ZEXT1664(ZEXT816(0) << 0x40);
            do {
              local_280 = &local_180;
              local_2a0 = local_300;
              uVar4 = *(uint *)(local_190 + lVar13 * 4);
              pRVar10 = (RayHitK<8> *)(ulong)uVar4;
              pGVar5 = (pSVar12->geometries).items[(long)pRVar10].ptr;
              if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                *(undefined4 *)(local_320 + lVar13 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_260 + lVar13 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_250 + lVar13 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_240 + lVar13 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_230 + lVar13 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1e0) = 0;
                  *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                  *(uint *)(ray + k * 4 + 0x220) = (sphere->primIDs).field_0.i[lVar13];
                  *(uint *)(ray + k * 4 + 0x240) = uVar4;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  return;
                }
                auStack_b0 = vpshufd_avx(ZEXT416(uVar4),0);
                local_e0 = (sphere->primIDs).field_0.i[lVar13];
                local_180._0_4_ = *(undefined4 *)(local_250 + lVar13 * 4);
                local_160 = *(undefined4 *)(local_240 + lVar13 * 4);
                uVar9 = *(undefined4 *)(local_230 + lVar13 * 4);
                local_140._4_4_ = uVar9;
                local_140._0_4_ = uVar9;
                local_140._8_4_ = uVar9;
                local_140._12_4_ = uVar9;
                local_140._16_4_ = uVar9;
                local_140._20_4_ = uVar9;
                local_140._24_4_ = uVar9;
                local_140._28_4_ = uVar9;
                local_180._4_4_ = local_180._0_4_;
                local_180._8_4_ = local_180._0_4_;
                local_180._12_4_ = local_180._0_4_;
                local_180._16_4_ = local_180._0_4_;
                local_180._20_4_ = local_180._0_4_;
                local_180._24_4_ = local_180._0_4_;
                local_180._28_4_ = local_180._0_4_;
                uStack_15c = local_160;
                uStack_158 = local_160;
                uStack_154 = local_160;
                uStack_150 = local_160;
                uStack_14c = local_160;
                uStack_148 = local_160;
                uStack_144 = local_160;
                local_100 = ZEXT1632(ZEXT816(0));
                local_120 = ZEXT1632(ZEXT816(0));
                uStack_dc = local_e0;
                uStack_d8 = local_e0;
                uStack_d4 = local_e0;
                uStack_d0 = local_e0;
                uStack_cc = local_e0;
                uStack_c8 = local_e0;
                uStack_c4 = local_e0;
                local_c0 = auStack_b0;
                uStack_9c = context->user->instID[0];
                local_a0 = uStack_9c;
                uStack_98 = uStack_9c;
                uStack_94 = uStack_9c;
                uStack_90 = uStack_9c;
                uStack_8c = uStack_9c;
                uStack_88 = uStack_9c;
                uStack_84 = uStack_9c;
                uStack_7c = context->user->instPrimID[0];
                local_80 = uStack_7c;
                uStack_78 = uStack_7c;
                uStack_74 = uStack_7c;
                uStack_70 = uStack_7c;
                uStack_6c = uStack_7c;
                uStack_68 = uStack_7c;
                uStack_64 = uStack_7c;
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_260 + lVar13 * 4);
                local_300 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar7 & 0xf) << 4));
                local_2f0 = *(undefined1 (*) [16])
                             (mm_lookupmask_ps + (long)((int)uVar7 >> 4) * 0x10);
                local_298 = pGVar5->userPtr;
                local_290 = context->user;
                local_278 = 8;
                pRVar10 = (RayHitK<8> *)pGVar5->intersectionFilterN;
                local_308 = sphere;
                local_288 = ray;
                if (pRVar10 != (RayHitK<8> *)0x0) {
                  local_2c0 = auVar43._0_16_;
                  local_2d0 = auVar45._0_16_;
                  local_270._0_8_ = pSVar12;
                  auVar30 = ZEXT1632(auVar50._0_16_);
                  pRVar10 = (RayHitK<8> *)(*(code *)pRVar10)(&local_2a0);
                  auVar52 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar30 = vcmpps_avx(auVar30,auVar30,0xf);
                  auVar50 = ZEXT3264(auVar30);
                  auVar45 = ZEXT1664(local_2d0);
                  auVar43 = ZEXT1664(local_2c0);
                  pSVar12 = (Scene *)local_270._0_8_;
                }
                auVar24 = vpcmpeqd_avx(auVar52._0_16_,local_300);
                auVar19 = vpcmpeqd_avx(auVar52._0_16_,local_2f0);
                auVar30._16_16_ = auVar19;
                auVar30._0_16_ = auVar24;
                auVar30 = auVar50._0_32_ & ~auVar30;
                if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar30 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar30 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar30 >> 0x7f,0) == '\0') &&
                      (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar30 >> 0xbf,0) == '\0') &&
                    (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar30[0x1f]) {
                  auVar15._0_4_ = auVar50._0_4_ ^ auVar24._0_4_;
                  auVar15._4_4_ = auVar50._4_4_ ^ auVar24._4_4_;
                  auVar15._8_4_ = auVar50._8_4_ ^ auVar24._8_4_;
                  auVar15._12_4_ = auVar50._12_4_ ^ auVar24._12_4_;
                  auVar15._16_4_ = auVar50._16_4_ ^ auVar19._0_4_;
                  auVar15._20_4_ = auVar50._20_4_ ^ auVar19._4_4_;
                  auVar15._24_4_ = auVar50._24_4_ ^ auVar19._8_4_;
                  auVar15._28_4_ = auVar50._28_4_ ^ auVar19._12_4_;
                  auVar48 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                  sphere = local_308;
                }
                else {
                  pRVar10 = (RayHitK<8> *)context->args->filter;
                  if ((pRVar10 != (RayHitK<8> *)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    local_2c0 = auVar43._0_16_;
                    local_2d0 = auVar45._0_16_;
                    local_270._0_8_ = pSVar12;
                    auVar30 = ZEXT1632(auVar50._0_16_);
                    pRVar10 = (RayHitK<8> *)(*(code *)pRVar10)(&local_2a0);
                    auVar52 = ZEXT1664(ZEXT816(0) << 0x40);
                    auVar30 = vcmpps_avx(auVar30,auVar30,0xf);
                    auVar50 = ZEXT3264(auVar30);
                    auVar45 = ZEXT1664(local_2d0);
                    auVar43 = ZEXT1664(local_2c0);
                    pSVar12 = (Scene *)local_270._0_8_;
                  }
                  auVar24 = vpcmpeqd_avx(auVar52._0_16_,local_300);
                  auVar19 = vpcmpeqd_avx(auVar52._0_16_,local_2f0);
                  auVar22._16_16_ = auVar19;
                  auVar22._0_16_ = auVar24;
                  auVar15._0_4_ = auVar50._0_4_ ^ auVar24._0_4_;
                  auVar15._4_4_ = auVar50._4_4_ ^ auVar24._4_4_;
                  auVar15._8_4_ = auVar50._8_4_ ^ auVar24._8_4_;
                  auVar15._12_4_ = auVar50._12_4_ ^ auVar24._12_4_;
                  auVar15._16_4_ = auVar50._16_4_ ^ auVar19._0_4_;
                  auVar15._20_4_ = auVar50._20_4_ ^ auVar19._4_4_;
                  auVar15._24_4_ = auVar50._24_4_ ^ auVar19._8_4_;
                  auVar15._28_4_ = auVar50._28_4_ ^ auVar19._12_4_;
                  auVar30 = auVar50._0_32_ & ~auVar22;
                  auVar48 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                  sphere = local_308;
                  if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar30 >> 0x7f,0) != '\0') ||
                        (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar30 >> 0xbf,0) != '\0') ||
                      (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar30[0x1f] < '\0') {
                    auVar30 = vmaskmovps_avx(auVar15,*local_280);
                    *(undefined1 (*) [32])(local_288 + 0x180) = auVar30;
                    auVar30 = vmaskmovps_avx(auVar15,local_280[1]);
                    *(undefined1 (*) [32])(local_288 + 0x1a0) = auVar30;
                    auVar30 = vmaskmovps_avx(auVar15,local_280[2]);
                    *(undefined1 (*) [32])(local_288 + 0x1c0) = auVar30;
                    auVar30 = vmaskmovps_avx(auVar15,local_280[3]);
                    *(undefined1 (*) [32])(local_288 + 0x1e0) = auVar30;
                    auVar30 = vmaskmovps_avx(auVar15,local_280[4]);
                    *(undefined1 (*) [32])(local_288 + 0x200) = auVar30;
                    auVar30 = vmaskmovps_avx(auVar15,local_280[5]);
                    *(undefined1 (*) [32])(local_288 + 0x220) = auVar30;
                    auVar30 = vmaskmovps_avx(auVar15,local_280[6]);
                    *(undefined1 (*) [32])(local_288 + 0x240) = auVar30;
                    auVar30 = vmaskmovps_avx(auVar15,local_280[7]);
                    *(undefined1 (*) [32])(local_288 + 0x260) = auVar30;
                    auVar30 = vmaskmovps_avx(auVar15,local_280[8]);
                    *(undefined1 (*) [32])(local_288 + 0x280) = auVar30;
                    pRVar10 = local_288;
                  }
                }
                if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar15 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar15 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar15 >> 0x7f,0) == '\0') &&
                      (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar15 >> 0xbf,0) == '\0') &&
                    (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar15[0x1f]) {
                  *(int *)(ray + k * 4 + 0x100) = auVar45._0_4_;
                }
                else {
                  auVar45 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                }
                *(undefined4 *)(local_320 + lVar13 * 4) = 0;
                auVar24 = vshufps_avx(auVar45._0_16_,auVar45._0_16_,0);
                auVar24 = vcmpps_avx(auVar43._0_16_,auVar24,2);
                local_320 = vandps_avx(auVar24,local_320);
              }
              if ((((local_320 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (local_320 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (local_320 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < local_320[0xf]) {
                return;
              }
              auVar24 = vblendvps_avx(auVar48._0_16_,auVar43._0_16_,local_320);
              auVar19 = vshufps_avx(auVar24,auVar24,0xb1);
              auVar19 = vminps_avx(auVar19,auVar24);
              auVar27 = vshufpd_avx(auVar19,auVar19,1);
              auVar19 = vminps_avx(auVar27,auVar19);
              auVar19 = vcmpps_avx(auVar24,auVar19,0);
              auVar27 = local_320 & auVar19;
              auVar24 = local_320;
              if ((((auVar27 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar27 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar27 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar27[0xf] < '\0') {
                auVar24 = vandps_avx(auVar19,local_320);
              }
              uVar9 = vmovmskps_avx(auVar24);
              uVar11 = CONCAT44((int)((ulong)pRVar10 >> 0x20),uVar9);
              lVar13 = 0;
              if (uVar11 != 0) {
                for (; (uVar11 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
                }
              }
            } while( true );
          }
          local_1b0 = auVar24;
          auStack_b0 = vpshufd_avx(ZEXT416(uVar4),0);
          local_e0 = (sphere->primIDs).field_0.i[lVar13];
          local_180._0_4_ = *(undefined4 *)(local_250 + lVar13 * 4);
          local_160 = *(undefined4 *)(local_240 + lVar13 * 4);
          uVar9 = *(undefined4 *)(local_230 + lVar13 * 4);
          local_140._4_4_ = uVar9;
          local_140._0_4_ = uVar9;
          local_140._8_4_ = uVar9;
          local_140._12_4_ = uVar9;
          local_140._16_4_ = uVar9;
          local_140._20_4_ = uVar9;
          local_140._24_4_ = uVar9;
          local_140._28_4_ = uVar9;
          local_180._4_4_ = local_180._0_4_;
          local_180._8_4_ = local_180._0_4_;
          local_180._12_4_ = local_180._0_4_;
          local_180._16_4_ = local_180._0_4_;
          local_180._20_4_ = local_180._0_4_;
          local_180._24_4_ = local_180._0_4_;
          local_180._28_4_ = local_180._0_4_;
          uStack_15c = local_160;
          uStack_158 = local_160;
          uStack_154 = local_160;
          uStack_150 = local_160;
          uStack_14c = local_160;
          uStack_148 = local_160;
          uStack_144 = local_160;
          local_100 = auVar58._0_32_;
          local_120 = auVar58._0_32_;
          uStack_dc = local_e0;
          uStack_d8 = local_e0;
          uStack_d4 = local_e0;
          uStack_d0 = local_e0;
          uStack_cc = local_e0;
          uStack_c8 = local_e0;
          uStack_c4 = local_e0;
          local_c0 = auStack_b0;
          auVar30 = vcmpps_avx(local_140,local_140,0xf);
          uStack_9c = context->user->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = context->user->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_260 + lVar13 * 4);
          local_300 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar7 & 0xf) << 4));
          local_2f0 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar7 >> 4) * 0x10);
          local_298 = pGVar5->userPtr;
          local_290 = context->user;
          local_278 = 8;
          pRVar10 = (RayHitK<8> *)pGVar5->intersectionFilterN;
          if (pRVar10 != (RayHitK<8> *)0x0) {
            local_2c0 = auVar43._0_16_;
            local_2d0 = auVar45._0_16_;
            local_210 = auVar52._0_16_;
            auVar30 = ZEXT1632(auVar30._0_16_);
            local_308 = sphere;
            local_2a8 = pSVar12;
            local_220 = auVar36;
            local_200 = auVar19;
            local_1f0 = auVar17;
            local_1e0 = auVar34;
            local_1d0 = auVar47;
            local_1c0 = auVar27;
            pRVar10 = (RayHitK<8> *)(*(code *)pRVar10)(&local_2a0);
            auVar30 = vcmpps_avx(auVar30,auVar30,0xf);
            auVar58 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar57 = ZEXT1664(local_220);
            auVar52 = ZEXT1664(local_210);
            auVar50 = ZEXT1664(local_200);
            auVar56 = ZEXT1664(local_1f0);
            auVar55 = ZEXT1664(local_1e0);
            auVar54 = ZEXT1664(local_1d0);
            auVar53 = ZEXT1664(local_1c0);
            auVar48 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            auVar45 = ZEXT1664(local_2d0);
            auVar43 = ZEXT1664(local_2c0);
            sphere = local_308;
            pSVar12 = local_2a8;
          }
          auVar24 = vpcmpeqd_avx(local_300,ZEXT816(0) << 0x40);
          auVar19 = vpcmpeqd_avx(local_2f0,ZEXT816(0) << 0x40);
          auVar29._16_16_ = auVar19;
          auVar29._0_16_ = auVar24;
          auVar29 = auVar30 & ~auVar29;
          if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar29 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar29 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar29 >> 0x7f,0) == '\0') &&
                (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar29 >> 0xbf,0) == '\0') &&
              (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar29[0x1f]) {
            auVar14._0_4_ = auVar24._0_4_ ^ auVar30._0_4_;
            auVar14._4_4_ = auVar24._4_4_ ^ auVar30._4_4_;
            auVar14._8_4_ = auVar24._8_4_ ^ auVar30._8_4_;
            auVar14._12_4_ = auVar24._12_4_ ^ auVar30._12_4_;
            auVar14._16_4_ = auVar19._0_4_ ^ auVar30._16_4_;
            auVar14._20_4_ = auVar19._4_4_ ^ auVar30._20_4_;
            auVar14._24_4_ = auVar19._8_4_ ^ auVar30._24_4_;
            auVar14._28_4_ = auVar19._12_4_ ^ auVar30._28_4_;
            auVar40 = ZEXT1664(local_1b0);
          }
          else {
            pRVar10 = (RayHitK<8> *)context->args->filter;
            auVar40 = ZEXT1664(local_1b0);
            if ((pRVar10 != (RayHitK<8> *)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
              local_2c0 = auVar43._0_16_;
              local_2d0 = auVar45._0_16_;
              local_1c0 = auVar53._0_16_;
              local_1d0 = auVar54._0_16_;
              local_1e0 = auVar55._0_16_;
              local_1f0 = auVar56._0_16_;
              local_200 = auVar50._0_16_;
              local_210 = auVar52._0_16_;
              local_220 = auVar57._0_16_;
              local_2a8 = pSVar12;
              pRVar10 = (RayHitK<8> *)(*(code *)pRVar10)(&local_2a0);
              auVar58 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar40 = ZEXT1664(local_1b0);
              auVar57 = ZEXT1664(local_220);
              auVar52 = ZEXT1664(local_210);
              auVar50 = ZEXT1664(local_200);
              auVar56 = ZEXT1664(local_1f0);
              auVar55 = ZEXT1664(local_1e0);
              auVar54 = ZEXT1664(local_1d0);
              auVar53 = ZEXT1664(local_1c0);
              auVar48 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              auVar45 = ZEXT1664(local_2d0);
              auVar43 = ZEXT1664(local_2c0);
              pSVar12 = local_2a8;
            }
            auVar27 = ZEXT816(0) << 0x40;
            auVar24 = vpcmpeqd_avx(local_300,auVar27);
            auVar19 = vpcmpeqd_avx(local_2f0,auVar27);
            auVar21._16_16_ = auVar19;
            auVar21._0_16_ = auVar24;
            auVar30 = vcmpps_avx(ZEXT1632(auVar27),ZEXT1632(auVar27),0xf);
            auVar14._0_4_ = auVar24._0_4_ ^ auVar30._0_4_;
            auVar14._4_4_ = auVar24._4_4_ ^ auVar30._4_4_;
            auVar14._8_4_ = auVar24._8_4_ ^ auVar30._8_4_;
            auVar14._12_4_ = auVar24._12_4_ ^ auVar30._12_4_;
            auVar14._16_4_ = auVar19._0_4_ ^ auVar30._16_4_;
            auVar14._20_4_ = auVar19._4_4_ ^ auVar30._20_4_;
            auVar14._24_4_ = auVar19._8_4_ ^ auVar30._24_4_;
            auVar14._28_4_ = auVar19._12_4_ ^ auVar30._28_4_;
            auVar30 = auVar30 & ~auVar21;
            if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar30 >> 0x7f,0) != '\0') ||
                  (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar30 >> 0xbf,0) != '\0') ||
                (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar30[0x1f] < '\0') {
              auVar30 = vmaskmovps_avx(auVar14,*local_280);
              *(undefined1 (*) [32])(local_288 + 0x180) = auVar30;
              auVar30 = vmaskmovps_avx(auVar14,local_280[1]);
              *(undefined1 (*) [32])(local_288 + 0x1a0) = auVar30;
              auVar30 = vmaskmovps_avx(auVar14,local_280[2]);
              *(undefined1 (*) [32])(local_288 + 0x1c0) = auVar30;
              auVar30 = vmaskmovps_avx(auVar14,local_280[3]);
              *(undefined1 (*) [32])(local_288 + 0x1e0) = auVar30;
              auVar30 = vmaskmovps_avx(auVar14,local_280[4]);
              *(undefined1 (*) [32])(local_288 + 0x200) = auVar30;
              auVar30 = vmaskmovps_avx(auVar14,local_280[5]);
              *(undefined1 (*) [32])(local_288 + 0x220) = auVar30;
              auVar30 = vmaskmovps_avx(auVar14,local_280[6]);
              *(undefined1 (*) [32])(local_288 + 0x240) = auVar30;
              auVar30 = vmaskmovps_avx(auVar14,local_280[7]);
              *(undefined1 (*) [32])(local_288 + 0x260) = auVar30;
              auVar30 = vmaskmovps_avx(auVar14,local_280[8]);
              *(undefined1 (*) [32])(local_288 + 0x280) = auVar30;
              pRVar10 = local_288;
            }
          }
          if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar14 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar14 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar14 >> 0x7f,0) == '\0') &&
                (auVar14 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar14 >> 0xbf,0) == '\0') &&
              (auVar14 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar14[0x1f]) {
            *(int *)(ray + k * 4 + 0x100) = auVar45._0_4_;
          }
          else {
            auVar45 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
          }
          *(undefined4 *)(local_320 + lVar13 * 4) = 0;
          auVar24 = vshufps_avx(auVar45._0_16_,auVar45._0_16_,0);
          auVar24 = vcmpps_avx(local_1a0,auVar24,2);
          local_320 = vandps_avx(auVar24,local_320);
        }
        uVar9 = (undefined4)((ulong)pRVar10 >> 0x20);
        auVar24 = auVar40._0_16_;
        auVar19 = auVar50._0_16_;
        auVar27 = auVar53._0_16_;
        auVar30 = auVar52._0_32_;
        auVar17 = auVar56._0_16_;
        auVar34 = auVar55._0_16_;
        auVar47 = auVar54._0_16_;
        auVar36 = auVar57._0_16_;
        if ((((local_320 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (local_320 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (local_320 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            -1 < local_320[0xf]) goto LAB_00761c59;
        auVar24 = vblendvps_avx(auVar48._0_16_,local_1a0,local_320);
        auVar19 = vshufps_avx(auVar24,auVar24,0xb1);
        auVar19 = vminps_avx(auVar19,auVar24);
        auVar27 = vshufpd_avx(auVar19,auVar19,1);
        auVar19 = vminps_avx(auVar27,auVar19);
        auVar19 = vcmpps_avx(auVar24,auVar19,0);
        auVar27 = local_320 & auVar19;
        auVar24 = local_320;
        if ((((auVar27 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar27 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar27 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar27[0xf] < '\0') {
          auVar24 = vandps_avx(auVar19,local_320);
        }
        uVar8 = vmovmskps_avx(auVar24);
        lVar13 = 0;
        if (CONCAT44(uVar9,uVar8) != 0) {
          for (; (CONCAT44(uVar9,uVar8) >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
          }
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& sphere)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom);
        const vbool<M> valid = sphere.valid();
        SphereIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Intersect1KEpilogM<M, K, filter>(ray, k, context, sphere.geomID(), sphere.primID()));
      }